

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O3

void __thiscall
Lib::
BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
::~BinaryHeap(BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
              *this)

{
  uint uVar1;
  UnresolvedSplitRecord *pUVar2;
  
  pUVar2 = this->_data;
  if (pUVar2 != (UnresolvedSplitRecord *)0x0) {
    uVar1 = this->_capacity;
    if (uVar1 != 1) {
      if (uVar1 == 0) {
        *(undefined8 *)pUVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pUVar2;
        return;
      }
      if (uVar1 < 3) {
        *(undefined8 *)pUVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pUVar2;
        return;
      }
      if (uVar1 == 3) {
        *(undefined8 *)pUVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pUVar2;
        return;
      }
      if (uVar1 < 5) {
        *(undefined8 *)pUVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pUVar2;
        return;
      }
      operator_delete(pUVar2,0x10);
      return;
    }
    *(undefined8 *)pUVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pUVar2;
  }
  return;
}

Assistant:

~BinaryHeap()
  {
    if(_data) {
      T* ep=_data+_size;
      while(ep!=_data1) {
	(--ep)->~T();
      }
      DEALLOC_KNOWN(_data,_capacity*sizeof(T),"BinaryHeap::T");
    }
  }